

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O2

double __thiscall BMRS_XZ<RemSP>::Get_RunAllocTime(BMRS_XZ<RemSP> *this)

{
  PerformanceEvaluator *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Run *pRVar5;
  unsigned_short *puVar6;
  size_t i;
  ulong uVar7;
  Run *pRVar8;
  size_t __n;
  Runs runs_temp;
  Runs local_30;
  
  pRVar5 = (this->data_runs).runs;
  pRVar8 = pRVar5;
  for (uVar7 = 0; uVar7 != (this->data_runs).height; uVar7 = uVar7 + 1) {
    do {
      puVar6 = &pRVar8->start_pos;
      pRVar8 = pRVar8 + 1;
    } while (*puVar6 != 0xffff);
  }
  __n = (long)pRVar8 - (long)pRVar5;
  this_00 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  PerformanceEvaluator::start(this_00);
  Runs::Alloc(&local_30,(this->data_runs).height,(this->data_runs).width);
  memset(local_30.runs,0,__n);
  PerformanceEvaluator::stop(this_00);
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  PerformanceEvaluator::start(this_00);
  memset(local_30.runs,0,__n);
  PerformanceEvaluator::stop(this_00);
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  Runs::Dealloc(&local_30);
  return (dVar1 * 1000.0) / dVar2 - (dVar3 * 1000.0) / dVar4;
}

Assistant:

double Get_RunAllocTime() {
        Run* run_start = data_runs.runs;
        Run* run_end = run_start;
        for (size_t i = 0; i < data_runs.height; i++, run_end++) {
            for (; run_end->start_pos != 0xFFFF; run_end++);
        }
        size_t size_used = (size_t)run_end - (size_t)run_start;

        Runs runs_temp;
        perf_.start();
        runs_temp.Alloc(data_runs.height, data_runs.width);
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t = perf_.last();

        perf_.start();
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t_result = t - perf_.last();

        runs_temp.Dealloc();
        return t_result;
    }